

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ExpectationBase * __thiscall
testing::internal::FunctionMocker<solitaire::interfaces::Solitaire_&()>::
UntypedFindMatchingExpectation
          (FunctionMocker<solitaire::interfaces::Solitaire_&()> *this,void *untyped_args,
          void **untyped_action,bool *is_excessive,ostream *what,ostream *why)

{
  bool bVar1;
  Action<solitaire::interfaces::Solitaire_&()> *local_70;
  Action<solitaire::interfaces::Solitaire_&()> *action;
  TypedExpectation<solitaire::interfaces::Solitaire_&()> *exp;
  MutexLock l;
  ArgumentTuple *args;
  ostream *why_local;
  ostream *what_local;
  bool *is_excessive_local;
  void **untyped_action_local;
  void *untyped_args_local;
  FunctionMocker<solitaire::interfaces::Solitaire_&()> *this_local;
  
  l.mutex_ = (MutexBase *)untyped_args;
  GTestMutexLock::GTestMutexLock((GTestMutexLock *)&exp,(MutexBase *)g_gmock_mutex);
  this_local = (FunctionMocker<solitaire::interfaces::Solitaire_&()> *)
               FindMatchingExpectationLocked(this,(ArgumentTuple *)l.mutex_);
  if ((TypedExpectation<solitaire::interfaces::Solitaire_&()> *)this_local ==
      (TypedExpectation<solitaire::interfaces::Solitaire_&()> *)0x0) {
    FormatUnexpectedCallMessageLocked(this,(ArgumentTuple *)l.mutex_,what,why);
    this_local = (FunctionMocker<solitaire::interfaces::Solitaire_&()> *)0x0;
  }
  else {
    bVar1 = ExpectationBase::IsSaturated((ExpectationBase *)this_local);
    *is_excessive = bVar1;
    local_70 = TypedExpectation<solitaire::interfaces::Solitaire_&()>::GetActionForArguments
                         ((TypedExpectation<solitaire::interfaces::Solitaire_&()> *)this_local,this,
                          (ArgumentTuple *)l.mutex_,what,why);
    if ((local_70 != (Action<solitaire::interfaces::Solitaire_&()> *)0x0) &&
       (bVar1 = Action<solitaire::interfaces::Solitaire_&()>::IsDoDefault(local_70), bVar1)) {
      local_70 = (Action<solitaire::interfaces::Solitaire_&()> *)0x0;
    }
    *untyped_action = local_70;
  }
  GTestMutexLock::~GTestMutexLock((GTestMutexLock *)&exp);
  return (ExpectationBase *)this_local;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    MutexLock l(&g_gmock_mutex);
    TypedExpectation<F>* exp = this->FindMatchingExpectationLocked(args);
    if (exp == nullptr) {  // A match wasn't found.
      this->FormatUnexpectedCallMessageLocked(args, what, why);
      return nullptr;
    }

    // This line must be done before calling GetActionForArguments(),
    // which will increment the call count for *exp and thus affect
    // its saturation status.
    *is_excessive = exp->IsSaturated();
    const Action<F>* action = exp->GetActionForArguments(this, args, what, why);
    if (action != nullptr && action->IsDoDefault())
      action = nullptr;  // Normalize "do default" to NULL.
    *untyped_action = action;
    return exp;
  }